

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

void AddThumb1SBit(MCInst *MI,_Bool InITBlock)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  MCOperand *Op;
  ulong uVar5;
  MCOperandInfo *m;
  
  uVar3 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar3].OpInfo;
  uVar3 = MCInst_getOpcode(MI);
  bVar1 = ARMInsts[uVar3].NumOperands;
  uVar3 = (uint)bVar1;
  uVar5 = 0;
  do {
    if (bVar1 == uVar5) {
LAB_001473cd:
      Op = MCOperand_CreateReg1(MI,(uint)!InITBlock + (uint)!InITBlock * 2);
      MCInst_insert0(MI,uVar3,Op);
      return;
    }
    uVar4 = MCInst_getNumOperands(MI);
    if (uVar5 == uVar4) {
LAB_001473ca:
      uVar3 = (uint)uVar5;
      goto LAB_001473cd;
    }
    _Var2 = MCOperandInfo_isOptionalDef(m);
    if ((_Var2) && (m->RegClass == 0xc)) {
      if (uVar5 != 0) {
        _Var2 = MCOperandInfo_isPredicate(m + -1);
        if (_Var2) goto LAB_001473c1;
      }
      goto LAB_001473ca;
    }
LAB_001473c1:
    uVar5 = uVar5 + 1;
    m = m + 1;
  } while( true );
}

Assistant:

static void AddThumb1SBit(MCInst *MI, bool InITBlock)
{
	MCOperandInfo *OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	unsigned short NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;
	unsigned i;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isOptionalDef(&OpInfo[i]) && OpInfo[i].RegClass == ARM_CCRRegClassID) {
			if (i > 0 && MCOperandInfo_isPredicate(&OpInfo[i-1])) continue;
			MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
			return;
		}
	}

	//MI.insert(I, MCOperand_CreateReg0(Inst, InITBlock ? 0 : ARM_CPSR));
	MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
}